

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

ssize_t __thiscall
httplib::Stream::write_format<char_const*,char_const*>
          (Stream *this,char *fmt,char **args,char **args_1)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ssize_t sVar3;
  long lVar4;
  char local_858 [8];
  array<char,_2048UL> buf;
  vector<char,_std::allocator<char>_> local_48;
  
  memset(local_858,0,0x800);
  uVar1 = snprintf(local_858,0x7ff,fmt,*args,*args_1);
  if ((int)uVar1 < 1) {
    sVar3 = (ssize_t)(int)uVar1;
  }
  else if (uVar1 < 0x7ff) {
    iVar2 = (*this->_vptr_Stream[5])(this,local_858,(ulong)uVar1);
    sVar3 = CONCAT44(extraout_var,iVar2);
  }
  else {
    lVar4 = 0x800;
    local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)operator_new(0x800);
    buf._M_elems._2040_8_ =
         local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start + 0x800;
    local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)buf._M_elems._2040_8_;
    memset(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start,0,0x800);
    local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)buf._M_elems._2040_8_;
    do {
      std::vector<char,_std::allocator<char>_>::resize(&local_48,lVar4 * 2);
      iVar2 = snprintf(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       (size_t)(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_finish +
                               ~(ulong)local_48.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_start),fmt,*args,*args_1);
      lVar4 = (long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start;
    } while (lVar4 - 1U <= (ulong)(long)iVar2);
    iVar2 = (*this->_vptr_Stream[5])();
    sVar3 = CONCAT44(extraout_var_00,iVar2);
    if (local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (char *)0x0) {
      operator_delete(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return sVar3;
}

Assistant:

inline ssize_t Stream::write_format(const char* fmt, const Args &...args) {
        const auto bufsiz = 2048;
        std::array<char, bufsiz> buf{};

        auto sn = snprintf(buf.data(), buf.size() - 1, fmt, args...);
        if (sn <= 0) { return sn; }

        auto n = static_cast<size_t>(sn);

        if (n >= buf.size() - 1) {
            std::vector<char> glowable_buf(buf.size());

            while (n >= glowable_buf.size() - 1) {
                glowable_buf.resize(glowable_buf.size() * 2);
                n = static_cast<size_t>(
                    snprintf(&glowable_buf[0], glowable_buf.size() - 1, fmt, args...));
            }
            return write(&glowable_buf[0], n);
        } else {
            return write(buf.data(), n);
        }
    }